

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utp_stream.cpp
# Opt level: O3

void libtorrent::aux::utp_stream::on_read
               (utp_stream *s,size_t bytes_transferred,error_code *ec,bool shutdown)

{
  function<void_(const_boost::system::error_code_&,_unsigned_long)> *pfVar1;
  _Manager_type *pp_Var2;
  undefined1 *puVar3;
  _Manager_type p_Var4;
  _Any_data local_68;
  _Manager_type local_58;
  _Invoker_type local_50;
  size_t local_48;
  undefined8 local_40;
  error_category *peStack_38;
  io_context *local_30;
  undefined4 local_24;
  
  local_30 = s->m_io_service;
  pfVar1 = &s->m_read_handler;
  local_68._M_unused._M_object = (void *)0x0;
  local_68._8_8_ = 0;
  local_58 = (_Manager_type)0x0;
  local_50 = (s->m_read_handler)._M_invoker;
  pp_Var2 = &(s->m_read_handler).super__Function_base._M_manager;
  p_Var4 = (s->m_read_handler).super__Function_base._M_manager;
  if (p_Var4 != (_Manager_type)0x0) {
    local_68._M_unused._0_8_ = (undefined8)*(undefined8 *)&(pfVar1->super__Function_base)._M_functor
    ;
    local_68._8_8_ = *(undefined8 *)((long)&(s->m_read_handler).super__Function_base._M_functor + 8)
    ;
    *pp_Var2 = (_Manager_type)0x0;
    (s->m_read_handler)._M_invoker = (_Invoker_type)0x0;
    local_58 = p_Var4;
  }
  local_40._0_4_ = ec->val_;
  local_40._4_1_ = ec->failed_;
  local_40._5_3_ = *(undefined3 *)&ec->field_0x5;
  peStack_38 = ec->cat_;
  local_24 = 1;
  local_48 = bytes_transferred;
  boost::asio::io_context::basic_executor_type<std::allocator<void>,0u>::
  execute<std::_Bind_result<void,std::function<void(boost::system::error_code_const&,unsigned_long)>(boost::system::error_code,unsigned_long)>>
            ((basic_executor_type<std::allocator<void>,0u> *)&local_30,
             (_Bind_result<void,_std::function<void_(const_boost::system::error_code_&,_unsigned_long)>_(boost::system::error_code,_unsigned_long)>
              *)&local_68);
  if (local_58 != (_Manager_type)0x0) {
    (*local_58)(&local_68,&local_68,__destroy_functor);
  }
  if (*pp_Var2 != (_Manager_type)0x0) {
    (**pp_Var2)((_Any_data *)pfVar1,(_Any_data *)pfVar1,__destroy_functor);
    *pp_Var2 = (_Manager_type)0x0;
    (s->m_read_handler)._M_invoker = (_Invoker_type)0x0;
  }
  if ((shutdown) && (s->m_impl != (utp_socket_impl *)0x0)) {
    puVar3 = &s->m_impl->field_0x21c;
    *puVar3 = *puVar3 & 0x7f;
    s->m_impl = (utp_socket_impl *)0x0;
  }
  return;
}

Assistant:

void utp_stream::on_read(utp_stream* s, std::size_t const bytes_transferred
	, error_code const& ec, bool const shutdown)
{
	UTP_LOGV("%8p: calling read handler read:%d ec:%s shutdown:%d\n", static_cast<void*>(s->m_impl)
		, int(bytes_transferred), ec.message().c_str(), shutdown);

	TORRENT_ASSERT(s->m_read_handler);
	TORRENT_ASSERT(bytes_transferred > 0 || ec || s->m_impl->null_buffers());
	post(s->m_io_service, std::bind<void>(std::move(s->m_read_handler), ec, bytes_transferred));
	s->m_read_handler = nullptr;
	if (shutdown && s->m_impl)
	{
		TORRENT_ASSERT(ec);
		s->m_impl->detach();
		s->m_impl = nullptr;
	}
}